

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          CappedArray<char,_14UL> *params_1,ArrayPtr<const_char> *params_2)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  size_t result_2;
  char *pcVar6;
  String local_68;
  char *local_48 [2];
  ArrayDisposer *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_68.content.ptr = (this->text).content.ptr;
  local_68.content.size_ = (size_t)params->ptr;
  local_68.content.disposer = *(ArrayDisposer **)params_1->content;
  sVar4 = 0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)&local_68.content.ptr + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  __return_storage_ptr__->size_ = sVar4;
  local_48[0] = local_68.content.ptr;
  local_48[1] = (char *)local_68.content.size_;
  local_38 = local_68.content.disposer;
  sVar4 = 0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_48 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  heapString(&local_68,sVar4);
  pcVar6 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar6 != (char *)0x0) {
    sVar4 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar6,1,sVar4,sVar4,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_68.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_68.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_68.content.disposer;
  local_48[0] = (char *)0x0;
  local_48[1] = (char *)0x0;
  local_38 = (ArrayDisposer *)0x0;
  sVar4 = 0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)local_48 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  local_68.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar4,sVar4,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_68.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_68.content.size_ = sVar4;
  if (pBVar2 != (Branch *)0x0) {
    sVar4 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_68.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_68.content.size_;
  (__return_storage_ptr__->branches).disposer = local_68.content.disposer;
  pcVar6 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->text).content.ptr;
  }
  pcVar3 = (this->text).content.ptr;
  if (pcVar3 != (char *)0x0) {
    memcpy(pcVar6,(void *)this->size_,(size_t)pcVar3);
    pcVar6 = pcVar6 + (long)pcVar3;
  }
  pcVar3 = params->ptr;
  if (pcVar3 != (char *)0x0) {
    memcpy(pcVar6,&params->size_,(size_t)pcVar3);
    pcVar6 = pcVar6 + (long)pcVar3;
  }
  if (*(size_t *)params_1->content != 0) {
    memcpy(pcVar6,(void *)params_1->currentSize,*(size_t *)params_1->content);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}